

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

bool slang::ast::Lookup::findAssertionLocalVar
               (ASTContext *context,NameSyntax *syntax,LookupResult *result)

{
  char *pcVar1;
  SyntaxKind SVar2;
  NameComponents name_00;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  bool bVar3;
  ulong extraout_RAX;
  int colonParts;
  NameComponents name;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int local_1d4;
  long local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ParameterValueAssignmentSyntax *local_198;
  NameComponents local_188;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> local_150 [3];
  
  local_1d4 = 0;
  pcVar1 = local_150[0].firstElement;
  local_150[0].len = 0;
  local_150[0].cap = 4;
  local_150[0].data_ = (pointer)pcVar1;
  if (((syntax->super_ExpressionSyntax).super_SyntaxNode.kind != ScopedName) ||
     (syntax = anon_unknown_39::splitScopedName((ScopedNameSyntax *)syntax,local_150,&local_1d4),
     local_1d4 == 0)) {
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    local_198 = (ParameterValueAssignmentSyntax *)0x0;
    SVar2 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
    if ((SVar2 - IdentifierName < 2) || (SVar2 == ClassName)) {
      anon_unknown_39::NameComponents::NameComponents(&local_188,syntax);
      findAssertionLocalVar();
      if ((extraout_RAX & 1) == 0) {
        result->found = *(Symbol **)(local_1d0 + 0x10);
        nameParts_00._M_extent._M_extent_value = local_150[0].len;
        nameParts_00._M_ptr = local_150[0].data_;
        name_00.text._M_str = (char *)uStack_1c0;
        name_00.text._M_len = local_1c8;
        name_00.range.startLoc = (SourceLocation)local_1b8;
        name_00.range.endLoc = (SourceLocation)uStack_1b0;
        name_00.selectors._M_ptr = (pointer)local_1a8;
        name_00.selectors._M_extent._M_extent_value = uStack_1a0;
        name_00.paramAssignments = local_198;
        bVar3 = anon_unknown_39::lookupDownward
                          (nameParts_00,name_00,context,(bitmask<slang::ast::LookupFlags>)0x0,result
                          );
        goto LAB_002f0914;
      }
    }
  }
  bVar3 = false;
LAB_002f0914:
  if (local_150[0].data_ != (pointer)pcVar1) {
    operator_delete(local_150[0].data_);
  }
  return bVar3;
}

Assistant:

bool Lookup::findAssertionLocalVar(const ASTContext& context, const NameSyntax& syntax,
                                   LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName) {
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);
        if (colonParts)
            return false;
    }

    NameComponents name;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = *first;
            break;
        default:
            return false;
    }

    auto inst = context.assertionInstance;
    SLANG_ASSERT(inst);

    while (inst->argDetails)
        inst = inst->argDetails;

    auto& map = inst->localVars;
    auto it = map.find(name.text);
    if (it == map.end())
        return false;

    result.found = it->second;
    return lookupDownward(nameParts, name, context, LookupFlags::None, result);
}